

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

void yyDone(GREG *G)

{
  _yythunk *p_Var1;
  int local_28;
  int yyleng;
  yythunk *thunk;
  int pos;
  GREG *G_local;
  
  for (thunk._4_4_ = 0; thunk._4_4_ < G->thunkpos; thunk._4_4_ = thunk._4_4_ + 1) {
    p_Var1 = G->thunks + thunk._4_4_;
    if (p_Var1->end == 0) {
      local_28 = p_Var1->begin;
    }
    else {
      local_28 = yyText(G,p_Var1->begin,p_Var1->end);
    }
    (*p_Var1->action)(G,G->text,local_28,p_Var1,G->data);
  }
  G->thunkpos = 0;
  return;
}

Assistant:

YY_LOCAL(void) yyDone(GREG *G)
{
  int pos;
  for (pos= 0; pos < G->thunkpos; ++pos)
    {
      yythunk *thunk= &G->thunks[pos];
      int yyleng= thunk->end ? yyText(G, thunk->begin, thunk->end) : thunk->begin;
      yyprintf((stderr, "DO [%d] %s", pos, thunk->name));
      yyprintfvTcontext(G->text);
      yyprintf((stderr, "\n"));
      thunk->action(G, G->text, yyleng, thunk, G->data);
    }
  G->thunkpos= 0;
}